

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agent.cpp
# Opt level: O0

void __thiscall so_5::agent_t::shutdown_agent(agent_t *this)

{
  lock_guard<so_5::rw_spinlock_t<so_5::yield_backoff_t>_> local_18;
  lock_guard<so_5::rw_spinlock_t<so_5::yield_backoff_t>_> queue_lock;
  agent_t *this_local;
  
  queue_lock._M_device = (mutex_type *)this;
  std::lock_guard<so_5::rw_spinlock_t<so_5::yield_backoff_t>_>::lock_guard
            (&local_18,&this->m_event_queue_lock);
  if (this->m_event_queue == (event_queue_t *)0x0) {
    details::abort_on_fatal_error<so_5::agent_t::shutdown_agent()::__1>
              ((anon_class_8_1_8991fb9c)this);
  }
  else {
    details::invoke_noexcept_code<so_5::agent_t::shutdown_agent()::__0>
              ((anon_class_8_1_8991fb9c)this);
    this->m_event_queue = (event_queue_t *)0x0;
  }
  std::lock_guard<so_5::rw_spinlock_t<so_5::yield_backoff_t>_>::~lock_guard(&local_18);
  return;
}

Assistant:

void
agent_t::shutdown_agent() SO_5_NOEXCEPT
{
	std::lock_guard< default_rw_spinlock_t > queue_lock{ m_event_queue_lock };

	// Since v.5.5.8 shutdown is done by two simple step:
	// - remove actual value from m_event_queue;
	// - pushing final demand to actual event queue.
	// 
	// No new demands will be sent to the agent, but all the subscriptions
	// remains. They will be destroyed at the very end of agent's lifetime.

	if( m_event_queue )
	{
		// Final event must be pushed to queue.
		so_5::details::invoke_noexcept_code( [&] {
				m_event_queue->push(
						execution_demand_t(
								this,
								message_limit::control_block_t::none(),
								0,
								typeid(void),
								message_ref_t(),
								&agent_t::demand_handler_on_finish ) );
			} );

		// No more events will be stored to the queue.
		m_event_queue = nullptr;
	}
	else
		so_5::details::abort_on_fatal_error( [&] {
			SO_5_LOG_ERROR( so_environment(), log_stream )
			{
				log_stream << "Unexpected error: m_event_queue contains "
					"nullptr. Unable to push demand_handler_on_finish for "
					"the agent (" << this << "). Application will be aborted"
					<< std::endl;
			}
		} );
}